

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O3

void __thiscall
soplex::
SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPrimalStatus(SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,Desc *desc,
                 SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *base,SPxId *id)

{
  Real RVar1;
  int iVar2;
  Status *pSVar3;
  bool *pbVar4;
  DataKey *pDVar5;
  cpp_dec_float<50U,_int,_void> *pcVar6;
  long lVar7;
  long in_FS_OFFSET;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_c8 [8];
  DataKey DStack_c0;
  DataKey local_b8;
  uint uStack_b0;
  undefined3 uStack_ab;
  uint local_a8;
  undefined3 uStack_a3;
  int local_a0;
  bool local_9c;
  DataKey local_98;
  double local_88;
  undefined8 uStack_80;
  SPxWeightST<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_70 = this;
  if ((id->super_DataKey).info < 0) {
    SPxRowId::SPxRowId((SPxRowId *)local_c8,id);
    iVar2 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)local_c8);
    lVar7 = (long)iVar2;
    pcVar6 = &(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend;
    ::soplex::infinity::__tls_init();
    local_88 = *(double *)(in_FS_OFFSET + -8);
    local_98.info = cpp_dec_float_finite;
    local_98.idx = 10;
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    DStack_c0.info = 0;
    DStack_c0.idx = 0;
    local_b8.info = 0;
    local_b8.idx = 0;
    _uStack_b0 = 0;
    uStack_ab = 0;
    _local_a8 = 0;
    uStack_a3 = 0;
    local_a0 = 0;
    local_9c = false;
    uStack_80 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_c8,local_88);
    if (((pcVar6->fpclass != cpp_dec_float_NaN) && (local_98.info != cpp_dec_float_NaN)) &&
       (iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar6,(cpp_dec_float<50U,_int,_void> *)local_c8), -1 < iVar2)) {
      pcVar6 = &(base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend;
      ::soplex::infinity::__tls_init();
      local_98.info = cpp_dec_float_finite;
      local_98.idx = 10;
      local_c8._0_4_ = 0;
      local_c8._4_4_ = 0;
      DStack_c0.info = 0;
      DStack_c0.idx = 0;
      local_b8.info = 0;
      local_b8.idx = 0;
      _uStack_b0 = 0;
      uStack_ab = 0;
      _local_a8 = 0;
      uStack_a3 = 0;
      local_a0 = 0;
      local_9c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_c8,-local_88);
      if (((pcVar6->fpclass != cpp_dec_float_NaN) && (local_98.info != cpp_dec_float_NaN)) &&
         (iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar6,(cpp_dec_float<50U,_int,_void> *)local_c8), iVar2 < 1)) {
        pSVar3 = (desc->rowstat).data;
        goto LAB_00342585;
      }
      pSVar3 = (desc->rowstat).data;
      goto LAB_00342543;
    }
    pcVar6 = &(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend;
    ::soplex::infinity::__tls_init();
    local_98.info = cpp_dec_float_finite;
    local_98.idx = 10;
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    DStack_c0.info = 0;
    DStack_c0.idx = 0;
    local_b8.info = 0;
    local_b8.idx = 0;
    _uStack_b0 = 0;
    uStack_ab = 0;
    _local_a8 = 0;
    uStack_a3 = 0;
    local_a0 = 0;
    local_9c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_c8,-local_88);
    if (((pcVar6->fpclass != cpp_dec_float_NaN) && (local_98.info != cpp_dec_float_NaN)) &&
       (iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar6,(cpp_dec_float<50U,_int,_void> *)local_c8), iVar2 < 1)) {
      pSVar3 = (desc->rowstat).data;
      goto LAB_00342561;
    }
    pcVar6 = &(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .left.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend;
    pDVar5 = (DataKey *)
             ((base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .right.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar7);
    RVar1 = Tolerances::epsilon((base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_68,RVar1);
    local_98.info = 0;
    local_98.idx = 10;
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    DStack_c0.info = 0;
    DStack_c0.idx = 0;
    local_b8.info = 0;
    local_b8.idx = 0;
    _uStack_b0 = 0;
    uStack_ab = 0;
    _local_a8 = 0;
    uStack_a3 = 0;
    local_a0 = 0;
    local_9c = false;
    if ((DataKey *)local_c8 != pDVar5) {
      _local_a8 = SUB85(pDVar5[4],0);
      uStack_a3 = SUB83(pDVar5[4],5);
      local_c8 = *(undefined1 (*) [8])pDVar5;
      DStack_c0 = pDVar5[1];
      local_b8 = pDVar5[2];
      _uStack_b0 = SUB85(pDVar5[3],0);
      uStack_ab = SUB83(pDVar5[3],5);
      local_a0 = pDVar5[5].info;
      local_9c = SUB41(pDVar5[5].idx,0);
      local_98 = pDVar5[6];
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)local_c8,&local_68);
    if (((pcVar6->fpclass != cpp_dec_float_NaN) && (local_98.info != cpp_dec_float_NaN)) &&
       (iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar6,(cpp_dec_float<50U,_int,_void> *)local_c8), -1 < iVar2)) {
      pSVar3 = (desc->rowstat).data;
      goto LAB_00342506;
    }
    pbVar4 = (local_70->rowRight).data;
    pSVar3 = (desc->rowstat).data;
  }
  else {
    SPxColId::SPxColId((SPxColId *)local_c8,id);
    iVar2 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(&(base->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set,(DataKey *)local_c8);
    lVar7 = (long)iVar2;
    pcVar6 = &(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend;
    ::soplex::infinity::__tls_init();
    local_88 = *(double *)(in_FS_OFFSET + -8);
    local_98.info = cpp_dec_float_finite;
    local_98.idx = 10;
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    DStack_c0.info = 0;
    DStack_c0.idx = 0;
    local_b8.info = 0;
    local_b8.idx = 0;
    _uStack_b0 = 0;
    uStack_ab = 0;
    _local_a8 = 0;
    uStack_a3 = 0;
    local_a0 = 0;
    local_9c = false;
    uStack_80 = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_c8,local_88);
    if (((pcVar6->fpclass != cpp_dec_float_NaN) && (local_98.info != cpp_dec_float_NaN)) &&
       (iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar6,(cpp_dec_float<50U,_int,_void> *)local_c8), -1 < iVar2)) {
      pcVar6 = &(base->
                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .low.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend;
      ::soplex::infinity::__tls_init();
      local_98.info = cpp_dec_float_finite;
      local_98.idx = 10;
      local_c8._0_4_ = 0;
      local_c8._4_4_ = 0;
      DStack_c0.info = 0;
      DStack_c0.idx = 0;
      local_b8.info = 0;
      local_b8.idx = 0;
      _uStack_b0 = 0;
      uStack_ab = 0;
      _local_a8 = 0;
      uStack_a3 = 0;
      local_a0 = 0;
      local_9c = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_c8,-local_88);
      if (((pcVar6->fpclass != cpp_dec_float_NaN) && (local_98.info != cpp_dec_float_NaN)) &&
         (iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (pcVar6,(cpp_dec_float<50U,_int,_void> *)local_c8), iVar2 < 1)) {
        pSVar3 = (desc->colstat).data;
LAB_00342585:
        pSVar3[lVar7] = P_FREE;
        return;
      }
      pSVar3 = (desc->colstat).data;
      goto LAB_00342543;
    }
    pcVar6 = &(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend;
    ::soplex::infinity::__tls_init();
    local_98.info = cpp_dec_float_finite;
    local_98.idx = 10;
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    DStack_c0.info = 0;
    DStack_c0.idx = 0;
    local_b8.info = 0;
    local_b8.idx = 0;
    _uStack_b0 = 0;
    uStack_ab = 0;
    _local_a8 = 0;
    uStack_a3 = 0;
    local_a0 = 0;
    local_9c = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_c8,-local_88);
    if (((pcVar6->fpclass != cpp_dec_float_NaN) && (local_98.info != cpp_dec_float_NaN)) &&
       (iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar6,(cpp_dec_float<50U,_int,_void> *)local_c8), iVar2 < 1)) {
      pSVar3 = (desc->colstat).data;
      goto LAB_00342561;
    }
    pcVar6 = &(base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .low.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar7].m_backend;
    pDVar5 = (DataKey *)
             ((base->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .up.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar7);
    RVar1 = Tolerances::epsilon((base->
                                super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                )._tolerances.
                                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr);
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_68,RVar1);
    local_98.info = 0;
    local_98.idx = 10;
    local_c8._0_4_ = 0;
    local_c8._4_4_ = 0;
    DStack_c0.info = 0;
    DStack_c0.idx = 0;
    local_b8.info = 0;
    local_b8.idx = 0;
    _uStack_b0 = 0;
    uStack_ab = 0;
    _local_a8 = 0;
    uStack_a3 = 0;
    local_a0 = 0;
    local_9c = false;
    if ((DataKey *)local_c8 != pDVar5) {
      _local_a8 = SUB85(pDVar5[4],0);
      uStack_a3 = SUB83(pDVar5[4],5);
      local_c8 = *(undefined1 (*) [8])pDVar5;
      DStack_c0 = pDVar5[1];
      local_b8 = pDVar5[2];
      _uStack_b0 = SUB85(pDVar5[3],0);
      uStack_ab = SUB83(pDVar5[3],5);
      local_a0 = pDVar5[5].info;
      local_9c = SUB41(pDVar5[5].idx,0);
      local_98 = pDVar5[6];
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
              ((cpp_dec_float<50U,_int,_void> *)local_c8,&local_68);
    if (((pcVar6->fpclass != cpp_dec_float_NaN) && (local_98.info != cpp_dec_float_NaN)) &&
       (iVar2 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (pcVar6,(cpp_dec_float<50U,_int,_void> *)local_c8), -1 < iVar2)) {
      pSVar3 = (desc->colstat).data;
LAB_00342506:
      pSVar3[lVar7] = P_FIXED;
      return;
    }
    pbVar4 = (local_70->colUp).data;
    pSVar3 = (desc->colstat).data;
  }
  if (pbVar4[lVar7] == true) {
LAB_00342561:
    pSVar3[lVar7] = P_ON_UPPER;
    return;
  }
LAB_00342543:
  pSVar3[lVar7] = P_ON_LOWER;
  return;
}

Assistant:

void SPxWeightST<R>::setPrimalStatus(
   typename SPxBasisBase<R>::Desc& desc,
   const SPxSolverBase<R>& base,
   const SPxId& id)
{
   if(id.isSPxRowId())
   {
      int n = base.number(SPxRowId(id));

      if(base.rhs(n) >= R(infinity))
      {
         if(base.lhs(n) <= R(-infinity))
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_FREE;
         else
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else
      {
         if(base.lhs(n) <= R(-infinity))
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else if(base.lhs(n) >= base.rhs(n) - base.epsilon())
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_FIXED;
         else if(rowRight[n])
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            desc.rowStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
   }
   else
   {
      int n = base.number(SPxColId(id));

      if(base.SPxLPBase<R>::upper(n) >= R(infinity))
      {
         if(base.SPxLPBase<R>::lower(n) <= R(-infinity))
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_FREE;
         else
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
      else
      {
         if(base.SPxLPBase<R>::lower(n) <= R(-infinity))
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else if(base.SPxLPBase<R>::lower(n) >= base.SPxLPBase<R>::upper(n) - base.epsilon())
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_FIXED;
         else if(colUp[n])
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_UPPER;
         else
            desc.colStatus(n) = SPxBasisBase<R>::Desc::P_ON_LOWER;
      }
   }
}